

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

void __thiscall Thread::~Thread(Thread *this)

{
  pointer pcVar1;
  _Manager_type p_Var2;
  
  if ((this->started_ == true) && (this->joined_ == false)) {
    pthread_detach(this->pthreadId_);
  }
  pthread_cond_destroy((pthread_cond_t *)&(this->latch_).condition_.cond);
  pthread_mutex_destroy((pthread_mutex_t *)&(this->latch_).mutex_);
  pcVar1 = (this->name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name_).field_2) {
    operator_delete(pcVar1);
  }
  p_Var2 = (this->func_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->func_,(_Any_data *)&this->func_,__destroy_functor);
  }
  return;
}

Assistant:

Thread::~Thread() {
    if(started_ && !joined_) pthread_detach(pthreadId_);
}